

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RJson.h
# Opt level: O0

RValue * __thiscall RJson::RDocument::last(RValue *__return_storage_ptr__,RDocument *this)

{
  bool bVar1;
  ValueIterator pGVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  ValueIterator iter;
  RDocument *this_local;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)this);
  if (bVar1) {
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this);
    alloc = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GetAllocator(&this->_doc);
    GenericRValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::GenericRValue
              (__return_storage_ptr__,pGVar2 + -1,alloc);
  }
  else {
    printf("RDocument is not an array, can not last!\n");
    GenericRValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::GenericRValue
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RValue last() {
        if (!_doc.IsArray()) {
            printf("RDocument is not an array, can not last!\n");
            return {};
        }

        auto iter = _doc.End()-1;
        return RValue(&(*iter), &_doc.GetAllocator());
    }